

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O0

CURLcode Curl_proxyCONNECT(Curl_easy *data,int sockindex,char *hostname,int remote_port)

{
  connectdata *conn_00;
  _Bool _Var1;
  connectdata *conn;
  CURLcode result;
  int remote_port_local;
  char *hostname_local;
  int sockindex_local;
  Curl_easy *data_local;
  
  conn_00 = data->conn;
  if (((conn_00->connect_state != (http_connect_state *)0x0) ||
      (data_local._4_4_ = connect_init(data,false), data_local._4_4_ == CURLE_OK)) &&
     ((data_local._4_4_ = CONNECT(data,sockindex,hostname,remote_port), data_local._4_4_ != CURLE_OK
      || (_Var1 = Curl_connect_complete(conn_00), _Var1)))) {
    Curl_connect_done(data);
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_proxyCONNECT(struct Curl_easy *data,
                           int sockindex,
                           const char *hostname,
                           int remote_port)
{
  CURLcode result;
  struct connectdata *conn = data->conn;
  if(!conn->connect_state) {
    result = connect_init(data, FALSE);
    if(result)
      return result;
  }
  result = CONNECT(data, sockindex, hostname, remote_port);

  if(result || Curl_connect_complete(conn))
    Curl_connect_done(data);

  return result;
}